

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeAtomicCmpxchg<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,uint8_t bytes)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  optional<unsigned_int> oVar3;
  undefined7 in_register_00000089;
  Memarg *pMVar4;
  Memarg *mem_00;
  uint bytes_00;
  optional<unsigned_long> oVar5;
  undefined1 local_e8 [8];
  MaybeResult<wasm::Name> mem;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  _Storage<unsigned_long,_true> local_a0;
  Type local_98;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_90;
  undefined1 auStack_88 [8];
  Result<wasm::WATParser::Memarg> arg;
  Result<wasm::WATParser::Memarg> _val_1;
  
  _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_4_ =
       SUB84(CONCAT71(in_register_00000089,bytes),0);
  _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._36_4_ = pos;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_e8,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_88,
                  (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e8);
  if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 8);
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),auStack_88
               ,CONCAT44(arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u.
                         _M_first._M_storage.offset._4_4_,
                         arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u.
                         _M_first._M_storage.offset._0_4_) + (long)auStack_88);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._8_8_;
    }
    *(uint64_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first._M_storage.
         offset;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_88);
  }
  else {
    local_98.id = type.id;
    local_90 = annotations;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_88);
    oVar5 = Lexer::takeOffset(&ctx->in);
    local_a0._M_value =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    oVar3 = Lexer::takeAlign(&ctx->in);
    auStack_88 = (undefined1  [8])0;
    if (((undefined1  [16])
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      auStack_88 = (undefined1  [8])local_a0;
    }
    bytes_00 = _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_4_ & 0xff;
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first._M_storage.offset
    ._0_4_ = oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
    if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first._M_storage.
      offset._0_4_ = _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_4_ & 0xff;
    }
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ = 0;
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)
                    ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)auStack_88);
    if (_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x01') {
      mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),
                 arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_,
                 _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first.
                 _M_storage.offset +
                 arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined8 *)
          mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ == &local_b0) {
        *puVar2 = local_b0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_a8;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_b0;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_b8;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)
                        ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)
                        ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
      mem_00 = (Memarg *)local_e8;
      if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
        mem_00 = (Memarg *)0x0;
      }
      pMVar4 = (Memarg *)auStack_88;
      if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ != '\0') {
        pMVar4 = (Memarg *)0x0;
      }
      ParseDefsCtx::makeAtomicCmpxchg
                (__return_storage_ptr__,ctx,
                 _val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._36_4_,local_90,
                 local_98,bytes_00,(Name *)mem_00,*pMVar4);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)auStack_88);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations,
                           Type type,
                           uint8_t bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeAtomicCmpxchg(
    pos, annotations, type, bytes, mem.getPtr(), *arg);
}